

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_member_in_struct
          (CompilerHLSL *this,SPIRVariable *var,uint32_t member_index,uint32_t location,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  uint32_t uVar1;
  SPIREntryPoint *pSVar2;
  SPIRType *pSVar3;
  Bitset *pBVar4;
  __hashtable *__h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  string local_220;
  undefined1 local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string mbr_name;
  string semantic;
  SPIRType type;
  
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar3);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
  to_semantic_abi_cxx11_(&semantic,this,location,pSVar2->model,var->storage);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (local_200,this,(ulong)type.super_IVariant.self.id,1);
  CompilerGLSL::to_member_name_abi_cxx11_(&local_220,&this->super_CompilerGLSL,&type,member_index);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (&mbr_name,(spirv_cross *)local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3e75a6,
             (char (*) [2])&local_220,ts_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_220._M_dataplus._M_p._4_4_,(uint32_t)local_220._M_dataplus._M_p) !=
      &local_220.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_220._M_dataplus._M_p._4_4_,(uint32_t)local_220._M_dataplus._M_p))
    ;
  }
  if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       *)local_200._0_8_ !=
      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       *)(local_200 + 0x10)) {
    operator_delete((void *)local_200._0_8_);
  }
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      type.member_types.
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                      [member_index].id);
  pBVar4 = Compiler::get_member_decoration_bitset
                     ((Compiler *)this,(TypeID)type.super_IVariant.self.id,member_index);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x35])(local_200,this,pBVar4);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_220,this,pSVar3,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&local_1e0,this,pSVar3,(ulong)(var->super_IVariant).self.id);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
             &local_220,(char (*) [2])0x3c91f1,&mbr_name,&local_1e0,(char (*) [4])0x40a6e8,&semantic
             ,(char (*) [2])0x405f81);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_220._M_dataplus._M_p._4_4_,(uint32_t)local_220._M_dataplus._M_p) !=
      &local_220.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_220._M_dataplus._M_p._4_4_,(uint32_t)local_220._M_dataplus._M_p))
    ;
  }
  if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       *)local_200._0_8_ !=
      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       *)(local_200 + 0x10)) {
    operator_delete((void *)local_200._0_8_);
  }
  uVar1 = type_to_consumed_locations(this,pSVar3);
  if (uVar1 != 0) {
    do {
      local_220._M_dataplus._M_p._0_4_ = location;
      local_200._0_8_ = active_locations;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)active_locations,&local_220,local_200);
      location = location + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
    operator_delete(mbr_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)semantic._M_dataplus._M_p != &semantic.field_2) {
    operator_delete(semantic._M_dataplus._M_p);
  }
  type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_004faf78;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&type.member_name_cache._M_h);
  type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &type.member_type_index_redirection.stack_storage) {
    free(type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &type.member_types.stack_storage) {
    free(type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)type.array_size_literal.super_VectorView<bool>.ptr !=
      &type.array_size_literal.stack_storage) {
    free(type.array_size_literal.super_VectorView<bool>.ptr);
  }
  type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)type.array.super_VectorView<unsigned_int>.ptr !=
      &type.array.stack_storage) {
    free(type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_member_in_struct(const SPIRVariable &var, uint32_t member_index,
                                                         uint32_t location,
                                                         std::unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);
	auto semantic = to_semantic(location, execution.model, var.storage);
	auto mbr_name = join(to_name(type.self), "_", to_member_name(type, member_index));
	auto &mbr_type = get<SPIRType>(type.member_types[member_index]);

	statement(to_interpolation_qualifiers(get_member_decoration_bitset(type.self, member_index)),
	          type_to_glsl(mbr_type),
	          " ", mbr_name, type_to_array_glsl(mbr_type, var.self),
	          " : ", semantic, ";");

	// Structs and arrays should consume more locations.
	uint32_t consumed_locations = type_to_consumed_locations(mbr_type);
	for (uint32_t i = 0; i < consumed_locations; i++)
		active_locations.insert(location + i);
}